

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_file_extra_owner(archive_read *a,archive_entry *e,ssize_t *extra_data_size)

{
  wchar_t wVar1;
  uint8_t *local_160;
  uint8_t *p;
  char namebuf [256];
  size_t local_50;
  size_t name_size;
  size_t name_len;
  uint64_t id;
  uint64_t value_size;
  uint64_t flags;
  ssize_t *extra_data_size_local;
  archive_entry *e_local;
  archive_read *a_local;
  
  value_size = 0;
  id = 0;
  name_len = 0;
  name_size = 0;
  local_50 = 0;
  flags = (uint64_t)extra_data_size;
  extra_data_size_local = (ssize_t *)e;
  e_local = (archive_entry *)a;
  wVar1 = read_var(a,&value_size,&id);
  if (wVar1 == L'\0') {
    a_local._4_4_ = L'\x01';
  }
  else {
    wVar1 = consume((archive_read *)e_local,id);
    if (wVar1 == L'\0') {
      *(uint64_t *)flags = *(long *)flags - id;
      if ((value_size & 1) != 0) {
        wVar1 = read_var_sized((archive_read *)e_local,&local_50,(size_t *)0x0);
        if (wVar1 == L'\0') {
          return L'\x01';
        }
        *(size_t *)flags = *(long *)flags - (local_50 + 1);
        wVar1 = read_ahead((archive_read *)e_local,local_50,&local_160);
        if (wVar1 == L'\0') {
          return L'\x01';
        }
        if (local_50 < 0x100) {
          name_size = local_50;
        }
        else {
          name_size = 0xff;
        }
        memcpy(&p,local_160,name_size);
        namebuf[name_size - 8] = '\0';
        wVar1 = consume((archive_read *)e_local,local_50);
        if (wVar1 != L'\0') {
          return L'\x01';
        }
        archive_entry_set_uname((archive_entry *)extra_data_size_local,(char *)&p);
      }
      if ((value_size & 2) != 0) {
        wVar1 = read_var_sized((archive_read *)e_local,&local_50,(size_t *)0x0);
        if (wVar1 == L'\0') {
          return L'\x01';
        }
        *(size_t *)flags = *(long *)flags - (local_50 + 1);
        wVar1 = read_ahead((archive_read *)e_local,local_50,&local_160);
        if (wVar1 == L'\0') {
          return L'\x01';
        }
        if (local_50 < 0x100) {
          name_size = local_50;
        }
        else {
          name_size = 0xff;
        }
        memcpy(&p,local_160,name_size);
        namebuf[name_size - 8] = '\0';
        wVar1 = consume((archive_read *)e_local,local_50);
        if (wVar1 != L'\0') {
          return L'\x01';
        }
        archive_entry_set_gname((archive_entry *)extra_data_size_local,(char *)&p);
      }
      if ((value_size & 4) != 0) {
        wVar1 = read_var((archive_read *)e_local,&name_len,&id);
        if (wVar1 == L'\0') {
          return L'\x01';
        }
        wVar1 = consume((archive_read *)e_local,id);
        if (wVar1 != L'\0') {
          return L'\x01';
        }
        *(uint64_t *)flags = *(long *)flags - id;
        archive_entry_set_uid((archive_entry *)extra_data_size_local,name_len);
      }
      if ((value_size & 8) != 0) {
        wVar1 = read_var((archive_read *)e_local,&name_len,&id);
        if (wVar1 == L'\0') {
          return L'\x01';
        }
        wVar1 = consume((archive_read *)e_local,id);
        if (wVar1 != L'\0') {
          return L'\x01';
        }
        *(uint64_t *)flags = *(long *)flags - id;
        archive_entry_set_gid((archive_entry *)extra_data_size_local,name_len);
      }
      a_local._4_4_ = L'\0';
    }
    else {
      a_local._4_4_ = L'\x01';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int parse_file_extra_owner(struct archive_read* a,
    struct archive_entry* e, ssize_t* extra_data_size)
{
	uint64_t flags = 0;
	uint64_t value_size = 0;
	uint64_t id = 0;
	size_t name_len = 0;
	size_t name_size = 0;
	char namebuf[OWNER_MAXNAMELEN];
	const uint8_t* p;

	if(!read_var(a, &flags, &value_size))
		return ARCHIVE_EOF;
	if(ARCHIVE_OK != consume(a, (int64_t)value_size))
		return ARCHIVE_EOF;
	*extra_data_size -= value_size;

	if ((flags & OWNER_USER_NAME) != 0) {
		if(!read_var_sized(a, &name_size, NULL))
			return ARCHIVE_EOF;
		*extra_data_size -= name_size + 1;

		if(!read_ahead(a, name_size, &p))
			return ARCHIVE_EOF;

		if (name_size >= OWNER_MAXNAMELEN) {
			name_len = OWNER_MAXNAMELEN - 1;
		} else {
			name_len = name_size;
		}

		memcpy(namebuf, p, name_len);
		namebuf[name_len] = 0;
		if(ARCHIVE_OK != consume(a, (int64_t)name_size))
			return ARCHIVE_EOF;

		archive_entry_set_uname(e, namebuf);
	}
	if ((flags & OWNER_GROUP_NAME) != 0) {
		if(!read_var_sized(a, &name_size, NULL))
			return ARCHIVE_EOF;
		*extra_data_size -= name_size + 1;

		if(!read_ahead(a, name_size, &p))
			return ARCHIVE_EOF;

		if (name_size >= OWNER_MAXNAMELEN) {
			name_len = OWNER_MAXNAMELEN - 1;
		} else {
			name_len = name_size;
		}

		memcpy(namebuf, p, name_len);
		namebuf[name_len] = 0;
		if(ARCHIVE_OK != consume(a, (int64_t)name_size))
			return ARCHIVE_EOF;

		archive_entry_set_gname(e, namebuf);
	}
	if ((flags & OWNER_USER_UID) != 0) {
		if(!read_var(a, &id, &value_size))
			return ARCHIVE_EOF;
		if(ARCHIVE_OK != consume(a, (int64_t)value_size))
			return ARCHIVE_EOF;
		*extra_data_size -= value_size;

		archive_entry_set_uid(e, (la_int64_t)id);
	}
	if ((flags & OWNER_GROUP_GID) != 0) {
		if(!read_var(a, &id, &value_size))
			return ARCHIVE_EOF;
		if(ARCHIVE_OK != consume(a, (int64_t)value_size))
			return ARCHIVE_EOF;
		*extra_data_size -= value_size;

		archive_entry_set_gid(e, (la_int64_t)id);
	}
	return ARCHIVE_OK;
}